

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmFileSet * __thiscall cmTarget::GetFileSet(cmTarget *this,string *name)

{
  bool bVar1;
  pointer pcVar2;
  pointer ppVar3;
  cmFileSet *local_38;
  _Self local_28;
  _Self local_20;
  iterator it;
  string *name_local;
  cmTarget *this_local;
  
  it._M_node = (_Base_ptr)name;
  pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
       ::find(&pcVar2->FileSets,it._M_node);
  pcVar2 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>_>
       ::end(&pcVar2->FileSets);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = (cmFileSet *)0x0;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileSet>_>
             ::operator->(&local_20);
    local_38 = &ppVar3->second;
  }
  return local_38;
}

Assistant:

cmFileSet* cmTarget::GetFileSet(const std::string& name)
{
  auto it = this->impl->FileSets.find(name);
  return it == this->impl->FileSets.end() ? nullptr : &it->second;
}